

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> __thiscall
slang::ast::RandSeqProductionSymbol::getRules(RandSeqProductionSymbol *this)

{
  undefined8 uVar1;
  RsRuleSyntax *syntax_00;
  bool bVar2;
  int iVar3;
  ProductionSyntax *pPVar4;
  StatementBlockSymbol *ruleBlock;
  Compilation *dst;
  undefined4 extraout_var;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> *psVar5;
  EVP_PKEY_CTX *src;
  const_iterator cVar6;
  LookupLocation lookupLocation;
  span<slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> local_398;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_388;
  Rule local_380;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_338;
  RsRuleSyntax *local_330;
  RsRuleSyntax *rule;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *__range3;
  SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> buffer;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
  blocks;
  undefined4 uStack_70;
  undefined1 local_60 [8];
  ASTContext context;
  SyntaxNode *syntax;
  RandSeqProductionSymbol *this_local;
  
  bVar2 = std::optional::operator_cast_to_bool((optional *)&this->rules);
  if (!bVar2) {
    context.assertionInstance = (AssertionInstanceDetails *)Symbol::getSyntax(&this->super_Symbol);
    uVar1 = LookupLocation::max;
    if (context.assertionInstance == (AssertionInstanceDetails *)0x0) {
      assert::assertFailed
                ("syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x53f,
                 "span<const RandSeqProductionSymbol::Rule> slang::ast::RandSeqProductionSymbol::getRules() const"
                );
    }
    uStack_70 = (undefined4)DAT_0091b918;
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&blocks.m_end,None);
    lookupLocation.index = uStack_70;
    lookupLocation.scope = (Scope *)uVar1;
    lookupLocation._12_4_ = 0;
    ASTContext::ASTContext
              ((ASTContext *)local_60,&this->super_Scope,lookupLocation,
               (bitmask<slang::ast::ASTFlags>)blocks.m_end.current);
    _blockIt = Scope::membersOfType<slang::ast::StatementBlockSymbol>(&this->super_Scope);
    buffer.stackBase._496_8_ =
         iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
         ::begin((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                  *)&blockIt);
    SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL>::SmallVector
              ((SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> *)&__range3);
    pPVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ProductionSyntax>
                       ((SyntaxNode *)context.assertionInstance);
    cVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::begin(&pPVar4->rules);
    __end3.index = (size_t)cVar6.list;
    cVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::end(&pPVar4->rules);
    while( true ) {
      __end3.list = (ParentList *)cVar6.index;
      rule = (RsRuleSyntax *)cVar6.list;
      bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::RsRuleSyntax_*,_unsigned_long,_const_slang::syntax::RsRuleSyntax_**,_const_slang::syntax::RsRuleSyntax_*&>
              ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::RsRuleSyntax_*,_unsigned_long,_const_slang::syntax::RsRuleSyntax_**,_const_slang::syntax::RsRuleSyntax_*&>
                            *)&__end3.index,
                           (iterator_base<const_slang::syntax::RsRuleSyntax_*> *)&rule);
      if (!bVar2) break;
      local_330 = slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::
                  iterator_base<const_slang::syntax::RsRuleSyntax_*>::operator*
                            ((iterator_base<const_slang::syntax::RsRuleSyntax_*> *)&__end3.index);
      local_338 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                  ::end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                         *)&blockIt);
      bVar2 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
              ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
                            *)(buffer.stackBase + 0x1f0),&local_338);
      syntax_00 = local_330;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        assert::assertFailed
                  ("blockIt != blocks.end()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,0x548,
                   "span<const RandSeqProductionSymbol::Rule> slang::ast::RandSeqProductionSymbol::getRules() const"
                  );
      }
      local_388 = Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++
                            ((specific_symbol_iterator<slang::ast::StatementBlockSymbol> *)
                             (buffer.stackBase + 0x1f0),0);
      ruleBlock = Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator*
                            (&local_388);
      createRule(&local_380,syntax_00,(ASTContext *)local_60,ruleBlock);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::push_back
                ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *)&__range3,&local_380)
      ;
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::RsRuleSyntax_*,_unsigned_long,_const_slang::syntax::RsRuleSyntax_**,_const_slang::syntax::RsRuleSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::RsRuleSyntax_*,_unsigned_long,_const_slang::syntax::RsRuleSyntax_**,_const_slang::syntax::RsRuleSyntax_*&>
                    *)&__end3.index);
      cVar6.index = (size_t)__end3.list;
      cVar6.list = (ParentList *)rule;
    }
    dst = ASTContext::getCompilation((ASTContext *)local_60);
    iVar3 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
                      ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *)&__range3,
                       (EVP_PKEY_CTX *)dst,src);
    local_398.data_ = (pointer)CONCAT44(extraout_var,iVar3);
    std::
    optional<nonstd::span_lite::span<slang::ast::RandSeqProductionSymbol::Rule_const,18446744073709551615ul>>
    ::operator=((optional<nonstd::span_lite::span<slang::ast::RandSeqProductionSymbol::Rule_const,18446744073709551615ul>>
                 *)&this->rules,&local_398);
    SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL>::~SmallVector
              ((SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> *)&__range3);
  }
  psVar5 = std::
           optional<nonstd::span_lite::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
           ::operator*(&this->rules);
  return *psVar5;
}

Assistant:

span<const RandSeqProductionSymbol::Rule> RandSeqProductionSymbol::getRules() const {
    if (!rules) {
        auto syntax = getSyntax();
        ASSERT(syntax);

        ASTContext context(*this, LookupLocation::max);

        auto blocks = membersOfType<StatementBlockSymbol>();
        auto blockIt = blocks.begin();

        SmallVector<Rule, 8> buffer;
        for (auto rule : syntax->as<ProductionSyntax>().rules) {
            ASSERT(blockIt != blocks.end());
            buffer.push_back(createRule(*rule, context, *blockIt++));
        }

        rules = buffer.copy(context.getCompilation());
    }
    return *rules;
}